

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O2

int cuddZddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  int iVar1;
  uint size;
  DdHalfWord DVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  ulong uVar11;
  DdHalfWord DVar12;
  DdHalfWord x;
  int iVar13;
  DdHalfWord y;
  DdHalfWord DVar14;
  DdHalfWord y_00;
  long lVar15;
  DdHalfWord DVar16;
  DdNode *pDVar17;
  ulong local_90;
  
  lVar15 = (long)((upper - lower) + 1);
  iVar13 = 0;
  local_90 = 0xffffffff;
  do {
    if (upper - lower < iVar13) {
      return 1;
    }
    if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
      iVar4 = -1;
      lVar6 = (long)lower * 0x38 + 0x10;
      for (uVar11 = (long)lower; (long)uVar11 <= (long)upper; uVar11 = uVar11 + 1) {
        iVar1 = *(int *)((long)&table->subtableZ->nodelist + lVar6);
        if (iVar4 < iVar1) {
          local_90 = uVar11;
          iVar4 = iVar1;
        }
        local_90 = local_90 & 0xffffffff;
        lVar6 = lVar6 + 0x38;
      }
      iVar4 = (int)local_90;
      DVar16 = upper;
      if (upper - iVar4 != 0) {
        lVar6 = Cudd_Random();
        DVar16 = iVar4 + (int)(lVar6 % (long)(upper - iVar4)) + 1;
      }
      DVar12 = lower;
      if (0 < iVar4 + ~lower) {
        do {
          uVar11 = Cudd_Random();
          DVar12 = (DdHalfWord)
                   ((long)((ulong)(uint)((int)uVar11 >> 0x1f) << 0x20 | uVar11 & 0xffffffff) %
                   (long)(iVar4 + ~lower));
        } while (DVar12 == DVar16);
      }
    }
    else {
      lVar6 = Cudd_Random();
      lVar6 = lVar6 % lVar15;
      do {
        lVar7 = Cudd_Random();
        lVar7 = lVar7 % lVar15;
      } while (lVar6 == lVar7);
      DVar16 = (int)lVar7 + lower;
      DVar12 = (int)lVar6 + lower;
    }
    DVar2 = DVar16;
    if ((int)DVar16 < (int)DVar12) {
      DVar2 = DVar12;
    }
    size = table->keysZ;
    if ((int)DVar12 < (int)DVar16) {
      DVar16 = DVar12;
    }
    x = DVar2 - 1;
    pDVar9 = (DdNode *)0x0;
    uVar3 = size;
    DVar12 = DVar16;
    y_00 = DVar2;
    while( true ) {
      y = DVar12 + 1;
      pDVar17 = pDVar9;
      DVar14 = y_00;
      if (y == x) {
        iVar4 = cuddZddSwapInPlace(table,DVar12,x);
        if ((iVar4 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
        goto LAB_00677a21;
        pDVar8->index = DVar12;
        pDVar8->ref = x;
        *(int *)((long)&pDVar8->next + 4) = iVar4;
        (pDVar8->type).kids.T = pDVar9;
        iVar4 = cuddZddSwapInPlace(table,x,y_00);
        pDVar17 = pDVar8;
        if ((iVar4 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
        goto LAB_00677a21;
        pDVar9->index = x;
        pDVar9->ref = y_00;
        *(int *)((long)&pDVar9->next + 4) = iVar4;
        (pDVar9->type).kids.T = pDVar8;
        uVar5 = cuddZddSwapInPlace(table,DVar12,x);
        pDVar17 = pDVar9;
        if ((uVar5 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
        goto LAB_00677a21;
        pDVar8->index = DVar12;
        y = x;
        y_00 = DVar12;
      }
      else {
        uVar5 = cuddZddSwapInPlace(table,DVar12,y);
        if (DVar12 == x) {
          if ((uVar5 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
          goto LAB_00677a21;
          pDVar8->index = DVar12;
          y_00 = DVar12;
        }
        else {
          if ((uVar5 == 0) || (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
          goto LAB_00677a21;
          pDVar10->index = DVar12;
          pDVar10->ref = y;
          *(uint *)((long)&pDVar10->next + 4) = uVar5;
          (pDVar10->type).kids.T = pDVar9;
          uVar5 = cuddZddSwapInPlace(table,x,y_00);
          pDVar17 = pDVar10;
          if ((uVar5 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
          goto LAB_00677a21;
          pDVar8->index = x;
          pDVar9 = pDVar10;
          DVar14 = y;
          y = y_00;
          y_00 = x;
        }
      }
      pDVar8->ref = y;
      *(uint *)((long)&pDVar8->next + 4) = uVar5;
      (pDVar8->type).kids.T = pDVar9;
      x = y_00 - 1;
      if (((int)DVar2 <= (int)DVar14) ||
         ((double)(int)uVar3 * table->maxGrowth < (double)(int)uVar5)) break;
      pDVar9 = pDVar8;
      DVar12 = DVar14;
      if ((int)uVar5 < (int)uVar3) {
        uVar3 = uVar5;
      }
    }
    if ((int)DVar16 < (int)y_00) {
      iVar4 = cuddZddSwapInPlace(table,x,y_00);
      pDVar17 = pDVar8;
      if ((iVar4 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0)) {
LAB_00677a21:
        pDVar8 = (DdNode *)0x0;
        while (pDVar17 != (DdNode *)0x0) {
          pDVar9 = (pDVar17->type).kids.T;
          pDVar17->ref = 0;
          pDVar17->next = table->nextFree;
          table->nextFree = pDVar17;
          pDVar17 = pDVar9;
        }
LAB_00677a67:
        while (pDVar8 != (DdNode *)0x0) {
          pDVar9 = (pDVar8->type).kids.T;
          pDVar8->ref = 0;
          pDVar8->next = table->nextFree;
          table->nextFree = pDVar8;
          pDVar8 = pDVar9;
        }
        return 0;
      }
      pDVar9->index = x;
      pDVar9->ref = y_00;
      *(int *)((long)&pDVar9->next + 4) = iVar4;
      (pDVar9->type).kids.T = pDVar8;
      pDVar8 = pDVar9;
    }
    iVar4 = cuddZddSiftingBackward(table,(Move *)pDVar8,size);
    if (iVar4 == 0) goto LAB_00677a67;
    pDVar9 = table->nextFree;
    while (pDVar8 != (DdNode *)0x0) {
      pDVar17 = (pDVar8->type).kids.T;
      pDVar8->ref = 0;
      pDVar8->next = pDVar9;
      pDVar9 = pDVar8;
      pDVar8 = pDVar17;
    }
    table->nextFree = pDVar9;
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

int
cuddZddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->sizeZ && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            /* Find pivot <= id with maximum keys. */
            for (max = -1, j = lower; j <= upper; j++) {
                if ((keys = table->subtableZ[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;      /* y = nvars-1 */
            } else {
                /* y = random # from {pivot+1 .. nvars-1} */
                y = pivot + 1 + (int) (Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {   /* if pivot = 1 or 0 */
                x = lower;
            } else {
                do { /* x = random # from {0 .. pivot-2} */
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
                  /* Is this condition really needed, since x and y
                     are in regions separated by pivot? */
            }
        } else {
            x = (int) (Cudd_Random() % nvars) + lower;
            do {
                y = (int) (Cudd_Random() % nvars) + lower;
            } while (x == y);
        }

        previousSize = table->keysZ;
        moves = zddSwapAny(table, x, y);
        if (moves == NULL)
            goto cuddZddSwappingOutOfMem;

        result = cuddZddSiftingBackward(table, moves, previousSize);
        if (!result)
            goto cuddZddSwappingOutOfMem;

        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    return(1);

cuddZddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(0);

}